

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O0

void anon_unknown.dwarf_442e::BandInit(int configuration,_func_int_int_int *Indexing,char *pattern)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long in_RDX;
  code *in_RSI;
  int in_EDI;
  int j;
  int i;
  int pick [3];
  int picks;
  int p [3] [2];
  int local_50;
  int local_4c;
  int local_48 [4];
  int local_38 [4];
  undefined4 local_28;
  undefined4 local_24;
  long local_18;
  code *local_10;
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = in_EDI % 6;
  local_38[3] = (int)((long)((ulong)(uint)((int)((long)in_EDI / 6) >> 0x1f) << 0x20 |
                            (long)in_EDI / 6 & 0xffffffffU) % 6);
  local_28 = (int)((long)((ulong)(uint)((int)((long)in_EDI / 0x24) >> 0x1f) << 0x20 |
                         (long)in_EDI / 0x24 & 0xffffffffU) % 6);
  local_24 = (int)((long)((ulong)(uint)((int)((long)in_EDI / 0xd8) >> 0x1f) << 0x20 |
                         (long)in_EDI / 0xd8 & 0xffffffffU) % 6);
  local_48[3] = in_EDI / 0x510;
  local_48[0] = local_48[3] % 3;
  local_48[1] = (int)((long)((ulong)(uint)((int)((long)local_48[3] / 3) >> 0x1f) << 0x20 |
                            (long)local_48[3] / 3 & 0xffffffffU) % 3);
  local_48[2] = local_48[3] / 9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_4c = 0; lVar2 = local_18, local_4c < 3; local_4c = local_4c + 1) {
    if (local_48[3] == 0x1b) {
      for (local_50 = 0; lVar2 = local_18, local_50 < 3; local_50 = local_50 + 1) {
        iVar4 = (*local_10)((long)(local_4c + 1) % 3 & 0xffffffff,local_50);
        lVar3 = local_18;
        uVar1 = *(undefined1 *)(lVar2 + iVar4);
        iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                             (long)local_50 * 4 +
                                             (long)local_38[(long)local_4c * 2] * 0xc) + 3);
        lVar2 = local_18;
        *(undefined1 *)(lVar3 + iVar4) = uVar1;
        iVar4 = (*local_10)((long)(local_4c + 2) % 3 & 0xffffffff,local_50);
        lVar3 = local_18;
        uVar1 = *(undefined1 *)(lVar2 + iVar4);
        iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                             (long)local_50 * 4 +
                                             (long)local_38[(long)local_4c * 2 + 1] * 0xc) + 6);
        *(undefined1 *)(lVar3 + iVar4) = uVar1;
      }
    }
    else {
      iVar4 = (*local_10)((long)(local_4c + 2) % 3 & 0xffffffff,
                          (long)local_48[(local_4c + 2) % 3] % 3 & 0xffffffff);
      lVar3 = local_18;
      uVar1 = *(undefined1 *)(lVar2 + iVar4);
      iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                           (long)(local_48[local_4c] % 3) * 4 +
                                           (long)local_38[(long)local_4c * 2] * 0xc) + 3);
      lVar2 = local_18;
      *(undefined1 *)(lVar3 + iVar4) = uVar1;
      iVar4 = (*local_10)((long)(local_4c + 1) % 3 & 0xffffffff,
                          (long)(local_48[(local_4c + 1) % 3] + 1) % 3 & 0xffffffff);
      lVar3 = local_18;
      uVar1 = *(undefined1 *)(lVar2 + iVar4);
      iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                           (long)((local_48[local_4c] + 1) % 3) * 4 +
                                           (long)local_38[(long)local_4c * 2] * 0xc) + 3);
      lVar2 = local_18;
      *(undefined1 *)(lVar3 + iVar4) = uVar1;
      iVar4 = (*local_10)((long)(local_4c + 1) % 3 & 0xffffffff,
                          (long)(local_48[(local_4c + 1) % 3] + 2) % 3 & 0xffffffff);
      lVar3 = local_18;
      uVar1 = *(undefined1 *)(lVar2 + iVar4);
      iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                           (long)((local_48[local_4c] + 2) % 3) * 4 +
                                           (long)local_38[(long)local_4c * 2] * 0xc) + 3);
      lVar2 = local_18;
      *(undefined1 *)(lVar3 + iVar4) = uVar1;
      iVar4 = (*local_10)((long)(local_4c + 1) % 3 & 0xffffffff,
                          (long)local_48[(local_4c + 1) % 3] % 3 & 0xffffffff);
      lVar3 = local_18;
      uVar1 = *(undefined1 *)(lVar2 + iVar4);
      iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                           (long)(local_48[local_4c] % 3) * 4 +
                                           (long)local_38[(long)local_4c * 2 + 1] * 0xc) + 6);
      lVar2 = local_18;
      *(undefined1 *)(lVar3 + iVar4) = uVar1;
      iVar4 = (*local_10)((long)(local_4c + 2) % 3 & 0xffffffff,
                          (long)(local_48[(local_4c + 2) % 3] + 1) % 3 & 0xffffffff);
      lVar3 = local_18;
      uVar1 = *(undefined1 *)(lVar2 + iVar4);
      iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                           (long)((local_48[local_4c] + 1) % 3) * 4 +
                                           (long)local_38[(long)local_4c * 2 + 1] * 0xc) + 6);
      lVar2 = local_18;
      *(undefined1 *)(lVar3 + iVar4) = uVar1;
      iVar4 = (*local_10)((long)(local_4c + 2) % 3 & 0xffffffff,
                          (long)(local_48[(local_4c + 2) % 3] + 2) % 3 & 0xffffffff);
      lVar3 = local_18;
      uVar1 = *(undefined1 *)(lVar2 + iVar4);
      iVar4 = (*local_10)(local_4c,*(int *)((anonymous_namespace)::permutations +
                                           (long)((local_48[local_4c] + 2) % 3) * 4 +
                                           (long)local_38[(long)local_4c * 2 + 1] * 0xc) + 6);
      *(undefined1 *)(lVar3 + iVar4) = uVar1;
    }
  }
  return;
}

Assistant:

void BandInit(int configuration, int (*Indexing)(int, int), char *pattern) {
    int p[3][2] { { 0, 0 },
                  { configuration % 6, (configuration / 6) % 6 },
                  { (configuration / 36) % 6, (configuration / 216) % 6}};
    int picks = configuration / 1296;
    int pick[] { picks % 3, (picks / 3) % 3, picks / 9 };
    for (int i = 0; i < 3; i++) {
        if (picks == 27) {
            for (int j = 0; j < 3; j++) {
                pattern[Indexing(i, permutations[p[i][0]][j] + 3)] = pattern[Indexing((i + 1) % 3, j)];
                pattern[Indexing(i, permutations[p[i][1]][j] + 6)] = pattern[Indexing((i + 2) % 3, j)];
            }
        } else {
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 0) % 3)] + 3)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 0) % 3)];
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 1) % 3)] + 3)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 1) % 3)];
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 2) % 3)] + 3)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 2) % 3)];

            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 0) % 3)] + 6)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 0) % 3)];
            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 1) % 3)] + 6)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 1) % 3)];
            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 2) % 3)] + 6)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 2) % 3)];
        }
    }
}